

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int get_pkcs_padding(uchar *input,size_t input_len,size_t *data_len)

{
  byte bVar1;
  byte local_3a;
  uchar bad;
  uchar padding_len;
  size_t pad_idx;
  size_t i;
  size_t *data_len_local;
  size_t input_len_local;
  uchar *input_local;
  
  if ((input == (uchar *)0x0) || (data_len == (size_t *)0x0)) {
    input_local._4_4_ = -0x6100;
  }
  else {
    bVar1 = input[input_len - 1];
    *data_len = input_len - bVar1;
    local_3a = input_len < bVar1 || bVar1 == 0;
    for (pad_idx = 0; pad_idx < input_len; pad_idx = pad_idx + 1) {
      local_3a = local_3a | (input[pad_idx] ^ bVar1) * (input_len - bVar1 <= pad_idx);
    }
    input_local._4_4_ = (uint)(local_3a != 0) * -0x6200;
  }
  return input_local._4_4_;
}

Assistant:

static int get_pkcs_padding( unsigned char *input, size_t input_len,
        size_t *data_len )
{
    size_t i, pad_idx;
    unsigned char padding_len, bad = 0;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    padding_len = input[input_len - 1];
    *data_len = input_len - padding_len;

    /* Avoid logical || since it results in a branch */
    bad |= padding_len > input_len;
    bad |= padding_len == 0;

    /* The number of bytes checked must be independent of padding_len,
     * so pick input_len, which is usually 8 or 16 (one block) */
    pad_idx = input_len - padding_len;
    for( i = 0; i < input_len; i++ )
        bad |= ( input[i] ^ padding_len ) * ( i >= pad_idx );

    return( MBEDTLS_ERR_CIPHER_INVALID_PADDING * ( bad != 0 ) );
}